

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::DescriptorBuilder::RecordPublicDependencies
          (DescriptorBuilder *this,FileDescriptor *file)

{
  bool bVar1;
  int iVar2;
  FileDescriptor *file_00;
  pair<std::_Rb_tree_const_iterator<const_google::protobuf::FileDescriptor_*>,_bool> pVar3;
  byte local_3d;
  int local_3c;
  int i;
  FileDescriptor *local_18;
  FileDescriptor *file_local;
  DescriptorBuilder *this_local;
  
  local_3d = 1;
  local_18 = file;
  file_local = (FileDescriptor *)this;
  if (file != (FileDescriptor *)0x0) {
    pVar3 = std::
            set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
            ::insert(&this->dependencies_,&local_18);
    local_3d = pVar3.second ^ 0xff;
  }
  if ((local_3d & 1) == 0) {
    local_3c = 0;
    while( true ) {
      bVar1 = false;
      if (local_18 != (FileDescriptor *)0x0) {
        iVar2 = FileDescriptor::public_dependency_count(local_18);
        bVar1 = local_3c < iVar2;
      }
      if (!bVar1) break;
      file_00 = FileDescriptor::public_dependency(local_18,local_3c);
      RecordPublicDependencies(this,file_00);
      local_3c = local_3c + 1;
    }
  }
  return;
}

Assistant:

void DescriptorBuilder::RecordPublicDependencies(const FileDescriptor* file) {
  if (file == NULL || !dependencies_.insert(file).second) return;
  for (int i = 0; file != NULL && i < file->public_dependency_count(); i++) {
    RecordPublicDependencies(file->public_dependency(i));
  }
}